

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

vec * cyclic_reduction(vec *__return_storage_ptr__,TridiagonalMatrix *m,vec *b)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  vec *pvVar6;
  vec *pvVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  double *pdVar11;
  double *pdVar12;
  uint uVar13;
  ulong __n;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  vec new_b;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  a_vecs;
  vec new_rhs;
  vec new_c;
  vec new_a;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  rhs_vecs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  c_vecs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  b_vecs;
  allocator_type local_121;
  TridiagonalMatrix *local_120;
  vec *local_118;
  vector<double,_std::allocator<double>_> local_110;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_f8;
  void *local_e0 [2];
  long local_d0;
  void *local_c8 [2];
  long local_b8;
  vector<double,_std::allocator<double>_> local_b0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_98;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_58;
  pointer local_40;
  undefined8 local_38;
  
  local_f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&local_f8,&m->as);
  local_58.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&local_58,&m->bs);
  local_78.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&local_78,&m->cs);
  local_98.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&local_98,b);
  uVar13 = m->size;
  local_118 = __return_storage_ptr__;
  if ((int)uVar13 < 2) {
    __n = (ulong)uVar13;
  }
  else {
    __n = (ulong)uVar13;
    local_120 = m;
    do {
      __n = __n >> 1;
      local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_b0,__n,(value_type_conflict *)&local_110,(allocator_type *)local_c8);
      local_c8[0] = (void *)0x0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_110,__n,(value_type_conflict *)local_c8,(allocator_type *)local_e0);
      local_e0[0] = (void *)0x0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_c8,__n,
                 (value_type_conflict *)local_e0,(allocator_type *)&local_38);
      local_38 = 0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_e0,__n,
                 (value_type_conflict *)&local_38,&local_121);
      if (1 < uVar13) {
        pdVar1 = local_f8.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar2 = local_58.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar3 = local_78.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar4 = local_98.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar14 = 0;
        do {
          pdVar12 = (double *)((long)pdVar3 + lVar14 * 2);
          pdVar11 = (double *)((long)pdVar2 + lVar14 * 2 + 8);
          auVar15._0_8_ = *pdVar11 * *pdVar12;
          auVar15._8_8_ = pdVar11[1] * pdVar12[1];
          auVar16._8_8_ = *(undefined8 *)((long)pdVar1 + lVar14 * 2 + 0x10);
          auVar16._0_8_ = *(undefined8 *)((long)pdVar1 + lVar14 * 2);
          auVar16 = divpd(auVar15,auVar16);
          *(double *)
           ((long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar14) =
               (*(double *)((long)pdVar1 + lVar14 * 2 + 8) - auVar16._0_8_) - auVar16._8_8_;
          *(double *)
           ((long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar14) =
               (-*(double *)((long)pdVar2 + lVar14 * 2) * *(double *)((long)pdVar2 + lVar14 * 2 + 8)
               ) / *(double *)((long)pdVar1 + lVar14 * 2);
          *(double *)((long)local_c8[0] + lVar14) =
               (-*(double *)((long)pdVar3 + lVar14 * 2 + 8) *
               *(double *)((long)pdVar3 + lVar14 * 2 + 0x10)) /
               *(double *)((long)pdVar1 + lVar14 * 2 + 0x10);
          *(double *)((long)local_e0[0] + lVar14) =
               (*(double *)((long)pdVar4 + lVar14 * 2 + 8) -
               (*(double *)((long)pdVar4 + lVar14 * 2) * *(double *)((long)pdVar2 + lVar14 * 2 + 8))
               / *(double *)((long)pdVar1 + lVar14 * 2)) -
               (*(double *)((long)pdVar4 + lVar14 * 2 + 0x10) *
               *(double *)((long)pdVar3 + lVar14 * 2 + 8)) /
               *(double *)((long)pdVar1 + lVar14 * 2 + 0x10);
          lVar14 = lVar14 + 8;
        } while (__n * 8 - lVar14 != 0);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_f8,&local_b0);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_58,&local_110);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_78,(value_type *)local_c8);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_98,(value_type *)local_e0);
      if (local_e0[0] != (void *)0x0) {
        operator_delete(local_e0[0],local_d0 - (long)local_e0[0]);
      }
      if (local_c8[0] != (void *)0x0) {
        operator_delete(local_c8[0],local_b8 - (long)local_c8[0]);
      }
      if (local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      bVar5 = 3 < uVar13;
      uVar13 = (uint)__n;
    } while (bVar5);
    uVar13 = local_120->size;
    m = local_120;
  }
  pvVar6 = local_118;
  local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (local_118,(long)(int)(uVar13 + 2),(value_type_conflict *)&local_b0,
             (allocator_type *)&local_110);
  pvVar7 = local_118;
  local_40 = local_f8.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)local_f8.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_f8.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_120 = (TridiagonalMatrix *)
              (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
  if ((int)uVar8 != 0) {
    iVar10 = m->size / 2 + 1;
    uVar8 = uVar8 & 0xffffffff;
    do {
      uVar8 = uVar8 - 1;
      if (0 < (int)__n) {
        pdVar1 = local_98.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar2 = local_58.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar3 = local_78.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar4 = local_f8.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar14 = (long)iVar10;
        uVar9 = 1;
        pdVar12 = (double *)local_120;
        do {
          pdVar12[lVar14] =
               ((pdVar1[uVar9 - 1] - pdVar2[uVar9 - 1] * *pdVar12) -
               pdVar3[uVar9 - 1] * pdVar12[lVar14 * 2]) / pdVar4[uVar9 - 1];
          pdVar12 = pdVar12 + lVar14 * 2;
          uVar9 = uVar9 + 2;
        } while (uVar9 <= __n);
      }
      __n = (ulong)((int)__n * 2 + 1);
      iVar10 = iVar10 / 2;
    } while (uVar8 != 0);
  }
  pdVar11 = (local_118->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish + -1;
  (local_118->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = pdVar11;
  pdVar12 = (double *)((long)local_120 + 8);
  if (pdVar12 != pdVar11) {
    memmove(local_120,pdVar12,(long)pdVar11 - (long)pdVar12);
    pdVar11 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  }
  (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = pdVar11 + -1;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_58);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_f8);
  return pvVar7;
}

Assistant:

vec cyclic_reduction(const TridiagonalMatrix& m, const vec& b)
{
	std::vector<vec > a_vecs;
	a_vecs.push_back(m.as);
	std::vector<vec > b_vecs;
	b_vecs.push_back(m.bs);
	std::vector<vec > c_vecs;
	c_vecs.push_back(m.cs);
	std::vector<vec > rhs_vecs;
	rhs_vecs.push_back(b);
	int equation_count = m.size;

	while (equation_count > 1)
	{
		equation_count /= 2;
		vec new_a(equation_count, 0.0);
		vec new_b(equation_count, 0.0);
		vec new_c(equation_count, 0.0);
		vec new_rhs(equation_count, 0.0);
		vec& old_a = a_vecs.back();
		vec& old_b = b_vecs.back();
		vec& old_c = c_vecs.back();
		vec& old_rhs = rhs_vecs.back();

		for (int i = 0; i < equation_count; i++)
		{
			int old_i = 2 * i + 1;
			new_a[i] = old_a[old_i] -
				old_b[old_i] * old_c[old_i - 1] / old_a[old_i - 1] -
				old_c[old_i] * old_b[old_i + 1] / old_a[old_i + 1];
			new_b[i] = -old_b[old_i - 1] * old_b[old_i] / old_a[old_i - 1];
			new_c[i] = -old_c[old_i] * old_c[old_i + 1] / old_a[old_i + 1];
			new_rhs[i] = old_rhs[old_i] -
				old_rhs[old_i - 1] * old_b[old_i] / old_a[old_i - 1] -
				old_rhs[old_i + 1] * old_c[old_i] / old_a[old_i + 1];
		}

		a_vecs.push_back(new_a);
		b_vecs.push_back(new_b);
		c_vecs.push_back(new_c);
		rhs_vecs.push_back(new_rhs);
	}

	// result is padded with one zero one both sides to emulate
	// implicit variables x_0 and x_N
	vec result(m.size + 2, 0.0);
	// factor maps indices of equations in full system extended with x_0=0
	// and x_N=0 onto indices of equations in reduced extended system
	int factor = m.size / 2 + 1;
	for (unsigned int i = a_vecs.size(); i-- > 0;)
	{
		vec& as = a_vecs[i];
		vec& bs = b_vecs[i];
		vec& cs = c_vecs[i];
		vec& rhs = rhs_vecs[i];

		// j is an index of an equation in the reduced system extended with
		// x_0=0 and x_N=0
		for (int j = 1; j < equation_count + 1; j += 2)
		{
			// index in coefficents arrays is less by 1 since they don't
			// include x_0=0 and x_N=0 equations
			int coeff_j = j - 1;
			// mapping j to the index in the full extended system
			int result_j = j * factor;
			int result_j_minus1 = result_j - factor;
			int result_j_plus1 = result_j + factor;

			result[result_j] =
				(rhs[coeff_j] - bs[coeff_j] * result[result_j_minus1] -
				cs[coeff_j] * result[result_j_plus1]) / as[coeff_j];
		}

		equation_count = equation_count * 2 + 1;
		factor /= 2;
	}

	// drop the padding
	result.pop_back();
	result.erase(result.begin());

	return result;
}